

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heapmanager.h
# Opt level: O0

void __thiscall
Hoard::HeapManager<HL::SpinLockType,_Hoard::HoardHeap<2048,_128>_>::releaseHeap
          (HeapManager<HL::SpinLockType,_Hoard::HoardHeap<2048,_128>_> *this)

{
  int iVar1;
  int iVar2;
  int heapIndex;
  int tid;
  lock_guard<HL::SpinLockType> g;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  std::lock_guard<HL::SpinLockType>::lock_guard
            ((lock_guard<HL::SpinLockType> *)
             CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (mutex_type *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  HL::CPUInfo::getThreadId();
  iVar1 = ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>::getTidMap
                    ((ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap> *)
                     CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     in_stack_ffffffffffffffbc);
  ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>::setInusemap
            ((ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap> *)
             CONCAT44(iVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc,
             in_stack_ffffffffffffffb8);
  iVar2 = ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>::getInusemap
                    ((ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap> *)
                     CONCAT44(iVar1,in_stack_ffffffffffffffc0),in_stack_ffffffffffffffbc);
  if (iVar2 < 0) {
    ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap>::setInusemap
              ((ThreadPoolHeap<2048,_128,_Hoard::PerThreadHoardHeap> *)CONCAT44(iVar1,iVar2),
               in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8);
  }
  std::lock_guard<HL::SpinLockType>::~lock_guard((lock_guard<HL::SpinLockType> *)0x117e6f);
  return;
}

Assistant:

void releaseHeap() {
      // Decrement the ref-count on the current heap.
      
      std::lock_guard<LockType> g (heapLock);
      
      // Statically ensure that the number of threads is a power of two.
      enum { VerifyPowerOfTwo = 1 / ((HeapType::MaxThreads & ~(HeapType::MaxThreads-1))) };
      
      auto tid = (int) (HL::CPUInfo::getThreadId() & (HeapType::MaxThreads - 1));
      auto heapIndex = HeapType::getTidMap (tid);
      
      HeapType::setInusemap (heapIndex, 0);
      
      // Prevent underruns (defensive programming).
      
      if (HeapType::getInusemap (heapIndex) < 0) {
	HeapType::setInusemap (heapIndex, 0);
      }
    }